

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O3

int hdr_log_read_header(hdr_log_reader *reader,FILE *file)

{
  int iVar1;
  char *pcVar2;
  char line [128];
  double local_c0;
  char local_b8 [136];
  
  while( true ) {
    iVar1 = fgetc((FILE *)file);
    ungetc(iVar1,(FILE *)file);
    if (iVar1 != 0x23) break;
    pcVar2 = fgets(local_b8,0x80,(FILE *)file);
    if (pcVar2 == (char *)0x0) goto LAB_00105b31;
    __isoc99_sscanf(local_b8,"#[Histogram log format version %d.%d]",reader);
    local_c0 = 0.0;
    iVar1 = __isoc99_sscanf(local_b8,"#[StartTime: %lf [^\n]",&local_c0);
    if (iVar1 == 1) {
      hdr_timespec_from_double(&reader->start_timestamp,local_c0);
    }
  }
  if ((iVar1 == 0x22) && (pcVar2 = fgets(local_b8,0x80,(FILE *)file), pcVar2 == (char *)0x0)) {
LAB_00105b31:
    iVar1 = 5;
  }
  else {
    iVar1 = -0x7529;
    if ((reader->major_version == 1) && (iVar1 = -0x7529, (uint)reader->minor_version < 4)) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int hdr_log_read_header(struct hdr_log_reader* reader, FILE* file)
{
    char line[HEADER_LINE_LENGTH]; /* TODO: check for overflow. */

    bool parsing_header = true;

    do
    {
        int c = fgetc(file);
        ungetc(c, file);

        switch (c)
        {

        case '#':
            if (fgets(line, HEADER_LINE_LENGTH, file) == NULL)
            {
                return EIO;
            }

            scan_header_line(reader, line);
            break;

        case '"':
            if (fgets(line, HEADER_LINE_LENGTH, file) == NULL)
            {
                return EIO;
            }

            parsing_header = false;
            break;

        default:
            parsing_header = false;
        }
    }
    while (parsing_header);

    if (!validate_log_version(reader))
    {
        return HDR_LOG_INVALID_VERSION;
    }

    return 0;
}